

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_c_tests.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  TestSuite *pTVar4;
  
  uVar2 = create_named_test_suite_
                    ("all_c_tests",
                     "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/all_c_tests.c"
                     ,0x22);
  uVar3 = create_text_reporter();
  pTVar4 = assertion_tests();
  add_suite_(uVar2,"assertion_tests()",pTVar4);
  pTVar4 = breadcrumb_tests();
  add_suite_(uVar2,"breadcrumb_tests()",pTVar4);
  pTVar4 = cgreen_value_tests();
  add_suite_(uVar2,"cgreen_value_tests()",pTVar4);
  pTVar4 = cdash_reporter_tests();
  add_suite_(uVar2,"cdash_reporter_tests()",pTVar4);
  pTVar4 = constraint_tests();
  add_suite_(uVar2,"constraint_tests()",pTVar4);
  pTVar4 = cute_reporter_tests();
  add_suite_(uVar2,"cute_reporter_tests()",pTVar4);
  pTVar4 = message_formatting_tests();
  add_suite_(uVar2,"message_formatting_tests()",pTVar4);
  pTVar4 = messaging_tests();
  add_suite_(uVar2,"messaging_tests()",pTVar4);
  pTVar4 = mock_tests();
  add_suite_(uVar2,"mock_tests()",pTVar4);
  pTVar4 = parameter_tests();
  add_suite_(uVar2,"parameter_tests()",pTVar4);
  pTVar4 = reflective_no_teardown_tests();
  add_suite_(uVar2,"reflective_no_teardown_tests()",pTVar4);
  pTVar4 = reflective_tests();
  add_suite_(uVar2,"reflective_tests()",pTVar4);
  pTVar4 = text_reporter_tests();
  add_suite_(uVar2,"text_reporter_tests()",pTVar4);
  pTVar4 = unit_tests();
  add_suite_(uVar2,"unit_tests()",pTVar4);
  pTVar4 = vector_tests();
  add_suite_(uVar2,"vector_tests()",pTVar4);
  pTVar4 = xml_reporter_tests();
  add_suite_(uVar2,"xml_reporter_tests()",pTVar4);
  pTVar4 = libxml_reporter_tests();
  add_suite_(uVar2,"libxml_reporter_tests()",pTVar4);
  if (argc < 2) {
    iVar1 = run_test_suite(uVar2,uVar3);
  }
  else {
    iVar1 = run_single_test(uVar2,argv[1],uVar3);
  }
  destroy_test_suite(uVar2);
  destroy_reporter(uVar3);
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    int suite_result;
    TestSuite *suite = create_named_test_suite("all_c_tests");
    TestReporter *reporter = create_text_reporter(); 

    add_suite(suite, assertion_tests());
    add_suite(suite, breadcrumb_tests());
    add_suite(suite, cgreen_value_tests());
    add_suite(suite, cdash_reporter_tests());
    add_suite(suite, constraint_tests());
#ifdef __cplusplus
    add_suite(suite, cpp_assertion_tests());
#endif
    add_suite(suite, cute_reporter_tests());
    add_suite(suite, message_formatting_tests());
    add_suite(suite, messaging_tests());
    add_suite(suite, mock_tests());
    add_suite(suite, parameter_tests());
    add_suite(suite, reflective_no_teardown_tests());
    add_suite(suite, reflective_tests());
    add_suite(suite, text_reporter_tests());
    add_suite(suite, unit_tests());
    add_suite(suite, vector_tests());
#if HAVE_XML_REPORTER
    add_suite(suite, xml_reporter_tests());
#endif
#if HAVE_LIBXML2_REPORTER
    add_suite(suite, libxml_reporter_tests());
#endif

    if (argc > 1) {
        suite_result = run_single_test(suite, argv[1], reporter);
    } else {
        suite_result = run_test_suite(suite, reporter);
    }

    destroy_test_suite(suite);
    destroy_reporter(reporter);

    return suite_result;
}